

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subscribe_options.h
# Opt level: O2

void __thiscall
miniros::SubscribeOptions::init<std_msgs::Empty_<std::allocator<void>>>
          (SubscribeOptions *this,string *_topic,uint32_t _queue_size,
          function<void_(const_std::shared_ptr<const_std_msgs::Empty_<std::allocator<void>_>_>_&)>
          *_callback,
          function<std::shared_ptr<std_msgs::Empty_<std::allocator<void>_>_>_()> *factory_fn)

{
  __shared_ptr<miniros::SubscriptionCallbackHelperT<const_std::shared_ptr<const_std_msgs::Empty_<std::allocator<void>_>_>_&,_void>,_(__gnu_cxx::_Lock_policy)2>
  _Stack_38;
  
  std::__cxx11::string::_M_assign((string *)this);
  this->queue_size = _queue_size;
  std::__cxx11::string::assign((char *)&this->md5sum);
  std::__cxx11::string::assign((char *)&this->datatype);
  std::
  make_shared<miniros::SubscriptionCallbackHelperT<std::shared_ptr<std_msgs::Empty_<std::allocator<void>>const>const&,void>,std::function<void(std::shared_ptr<std_msgs::Empty_<std::allocator<void>>const>const&)>const&,std::function<std::shared_ptr<std_msgs::Empty_<std::allocator<void>>>()>const&>
            ((function<void_(const_std::shared_ptr<const_std_msgs::Empty_<std::allocator<void>_>_>_&)>
              *)&_Stack_38,
             (function<std::shared_ptr<std_msgs::Empty_<std::allocator<void>_>_>_()> *)_callback);
  std::__shared_ptr<miniros::SubscriptionCallbackHelper,(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<miniros::SubscriptionCallbackHelper,(__gnu_cxx::_Lock_policy)2> *)
             &this->helper,&_Stack_38);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_38._M_refcount);
  return;
}

Assistant:

void init(const std::string& _topic, uint32_t _queue_size,
       const std::function<void (const std::shared_ptr<M const>&)>& _callback,
       const std::function<std::shared_ptr<M>(void)>& factory_fn = DefaultMessageCreator<M>())
  {
    typedef typename ParameterAdapter<M>::Message MessageType;
    topic = _topic;
    queue_size = _queue_size;
    md5sum = message_traits::md5sum<MessageType>();
    datatype = message_traits::datatype<MessageType>();
    helper = std::make_shared<SubscriptionCallbackHelperT<const std::shared_ptr<MessageType const>&> >(_callback, factory_fn);
  }